

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O2

void redraw(Am_Drawonable *d)

{
  long lVar1;
  char *pcVar2;
  Am_Drawonable *pAVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  if (d1 == d) {
    lVar1 = *(long *)d1;
    pcVar2 = "Top-level window";
    puVar4 = &font1;
    uVar6 = 0x10;
    uVar5 = 0x57;
    pAVar3 = d1;
  }
  else {
    if (d2 == d) {
      lVar1 = *(long *)d2;
      pcVar2 = "Child of top-level";
      puVar4 = &font2;
      uVar6 = 0x12;
      pAVar3 = d2;
    }
    else {
      lVar1 = *(long *)d3;
      pcVar2 = "Child of child window";
      puVar4 = &font3;
      uVar6 = 0x15;
      pAVar3 = d3;
    }
    uVar5 = 7;
  }
  (**(code **)(lVar1 + 0x170))(pAVar3,&black,pcVar2,uVar6,puVar4,5,uVar5,0,&Am_No_Style,0);
  (**(code **)(*(long *)d1 + 0xa0))();
  return;
}

Assistant:

void
redraw(Am_Drawonable *d)
{
  static const char *string1 = "Top-level window";
  static int string1_len = 16;
  static const char *string2 = "Child of top-level";
  static int string2_len = 18;
  static const char *string3 = "Child of child window";
  static int string3_len = 21;

  if (d == d1)
    d1->Draw_Text(black, string1, string1_len, font1, 5, 87);
  else if (d == d2)
    d2->Draw_Text(black, string2, string2_len, font2, 5, 7);
  else
    d3->Draw_Text(black, string3, string3_len, font3, 5, 7);
  d1->Flush_Output();
}